

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O2

TypeBase ** __thiscall
SmallDenseMap<TypeModulePair,_TypeBase_*,_TypeModulePairHasher,_32U>::find
          (SmallDenseMap<TypeModulePair,_TypeBase_*,_TypeModulePairHasher,_32U> *this,
          TypeModulePair *key)

{
  uint uVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  Node *this_00;
  TypeModulePair local_48;
  
  uVar1 = this->bucketCount;
  uVar3 = TypeModulePairHasher::operator()((TypeModulePairHasher *)&local_48,key);
  uVar4 = 0;
  while( true ) {
    if (this->bucketCount <= uVar4) {
      return (TypeBase **)0x0;
    }
    uVar3 = uVar3 & uVar1 - 1;
    this_00 = this->data + uVar3;
    local_48.typeName.begin = (char *)0x0;
    local_48.typeName.end = (char *)0x0;
    local_48.importModule = (ModuleData *)0x0;
    bVar2 = TypeModulePair::operator==(&this_00->key,&local_48);
    if (bVar2) break;
    bVar2 = TypeModulePair::operator==(&this_00->key,key);
    if (bVar2) {
      return &this_00->value;
    }
    uVar3 = uVar3 + uVar4 + 1;
    uVar4 = uVar4 + 1;
  }
  return (TypeBase **)0x0;
}

Assistant:

Value* find(const Key& key) const
	{
		unsigned bucketMask = bucketCount - 1;
		unsigned bucket = Hasher()(key) & bucketMask;

		for(unsigned i = 0; i < bucketCount; i++)
		{
			Node &item = data[bucket];

			if(item.key == Key())
				return NULL;

			if(item.key == key)
				return &item.value;

			// Quadratic probing
			bucket = (bucket + i + 1) & bucketMask;
		}

		return NULL;
	}